

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

string * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename_abi_cxx11_
          (string *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die,
          Dwarf_Unsigned file_i)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  char *pcVar3;
  size_type sVar4;
  cache_mode cVar5;
  int iVar6;
  Dwarf_Error pDVar7;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
  _Var8;
  size_t sVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>,_bool>
  pVar13;
  char **in_stack_ffffffffffffffa8;
  long local_50;
  Dwarf_Error local_48 [2];
  long local_38;
  
  for (; (this->skeleton).holds_value == true; this = (this->skeleton).field_0.uvalue.resolver) {
    cu_die = (die_object *)&this->skeleton;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar5 = get_cache_mode();
  if (cVar5 == prioritize_memory) {
    local_48[0] = (Dwarf_Error)0x0;
    iVar6 = dwarf_srcfiles(cu_die->die,(char ***)&stack0xffffffffffffffa8,&local_50,local_48);
    if (iVar6 == 1) {
      handle_dwarf_error(this->dbg,local_48[0]);
    }
    if (iVar6 != 0) {
      assert_fail((detail *)0x1,0x197cbf,
                  "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                  ,(source_location)ZEXT816(0x158),(char *)in_stack_ffffffffffffffa8);
    }
    if ((long)file_i < local_50) {
      pcVar3 = in_stack_ffffffffffffffa8[file_i];
      sVar4 = __return_storage_ptr__->_M_string_length;
      sVar9 = strlen(pcVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (__return_storage_ptr__,0,sVar4,pcVar3,sVar9);
    }
    dwarf_dealloc(cu_die->dbg,in_stack_ffffffffffffffa8,0xf);
  }
  else {
    pDVar7 = (Dwarf_Error)die_object::get_global_offset(cu_die);
    uVar1 = (this->srcfiles_cache)._M_h._M_bucket_count;
    uVar10 = (ulong)pDVar7 % uVar1;
    p_Var11 = (this->srcfiles_cache)._M_h._M_buckets[uVar10];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var11->_M_nxt, p_Var12 = p_Var11,
       pDVar7 != (Dwarf_Error)p_Var11->_M_nxt[1]._M_nxt)) {
      while (p_Var11 = p_Var2, p_Var2 = p_Var11->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar10) ||
           (p_Var12 = p_Var11, pDVar7 == (Dwarf_Error)p_Var2[1]._M_nxt)) goto LAB_001453a5;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_001453a5:
    if (p_Var12 == (__node_base_ptr)0x0) {
      _Var8._M_cur = (__node_type *)0x0;
    }
    else {
      _Var8._M_cur = (__node_type *)p_Var12->_M_nxt;
    }
    if (_Var8._M_cur == (__node_type *)0x0) {
      local_48[0] = (Dwarf_Error)0x0;
      iVar6 = dwarf_srcfiles(cu_die->die,(char ***)&stack0xffffffffffffffa8,&local_50,local_48);
      if (iVar6 == 1) {
        handle_dwarf_error(this->dbg,local_48[0]);
      }
      if (iVar6 != 0) {
        assert_fail((detail *)0x1,0x197cbf,
                    "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                    ,(source_location)ZEXT816(0x164),(char *)in_stack_ffffffffffffffa8);
      }
      local_38 = local_50;
      local_48[0] = pDVar7;
      pVar13 = std::
               _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::pair<char**,long_long>>,std::allocator<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>
                         ((_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::pair<char**,long_long>>,std::allocator<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->srcfiles_cache);
      _Var8._M_cur = (__node_type *)
                     pVar13.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                     ._M_cur;
    }
    if ((long)file_i <
        *(long *)((long)&((_Var8._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>
                         ._M_storage._M_storage + 0x10)) {
      pcVar3 = *(char **)(*(long *)((long)&((_Var8._M_cur)->
                                           super__Hash_node_value<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>
                                           ._M_storage._M_storage + 8) + file_i * 8);
      sVar4 = __return_storage_ptr__->_M_string_length;
      sVar9 = strlen(pcVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (__return_storage_ptr__,0,sVar4,pcVar3,sVar9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string resolve_filename(const die_object& cu_die, Dwarf_Unsigned file_i) {
            // for split-dwarf line resolution happens in the skeleton
            if(skeleton) {
                return skeleton.unwrap().resolver.resolve_filename(skeleton.unwrap().cu_die, file_i);
            }
            std::string filename;
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                char** dw_srcfiles;
                Dwarf_Signed dw_filecount;
                VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
                dwarf_dealloc(cu_die.dbg, dw_srcfiles, DW_DLA_LIST);
            } else {
                auto off = cu_die.get_global_offset();
                auto it = srcfiles_cache.find(off);
                if(it == srcfiles_cache.end()) {
                    char** dw_srcfiles;
                    Dwarf_Signed dw_filecount;
                    VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                    it = srcfiles_cache.insert(it, {off, {dw_srcfiles, dw_filecount}});
                }
                char** dw_srcfiles = it->second.first;
                Dwarf_Signed dw_filecount = it->second.second;
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
            }
            return filename;
        }